

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O3

void __thiscall cmXMLParser::ReportError(cmXMLParser *this,int line,int param_2,char *msg)

{
  ostream *poVar1;
  size_t sVar2;
  
  if (this->ReportCallback != (ReportFunction)0x0) {
    (*this->ReportCallback)(line,msg,this->ReportCallbackData);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error parsing XML in stream at line ",0x24);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if (msg == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,msg,sVar2);
  }
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void cmXMLParser::ReportError(int line, int /*unused*/, const char* msg)
{
  if (this->ReportCallback) {
    this->ReportCallback(line, msg, this->ReportCallbackData);
  } else {
    std::cerr << "Error parsing XML in stream at line " << line << ": " << msg
              << std::endl;
  }
}